

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O0

void __thiscall Restaurant::goBackup(Restaurant *this)

{
  value_type this_00;
  value_type local_30 [3];
  value_type local_18;
  BackupRestaurant *newBackup;
  Restaurant *this_local;
  
  newBackup = (BackupRestaurant *)this;
  this_00 = (value_type)operator_new(0x30);
  BackupRestaurant::BackupRestaurant((BackupRestaurant *)this_00);
  local_30[0] = this_00;
  local_18 = this_00;
  std::vector<BaseAction_*,_std::allocator<BaseAction_*>_>::push_back(&this->actionsLog,local_30);
  (**((BaseAction *)&local_18->_vptr_BaseAction)->_vptr_BaseAction)(local_18,this);
  return;
}

Assistant:

void Restaurant::goBackup()
{
    auto * newBackup = new BackupRestaurant();
    actionsLog.push_back(newBackup);
    newBackup->act(*this);
}